

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue::Provide::~Provide
          (Provide *this)

{
  Entry *pEVar1;
  Disposer *pDVar2;
  HashBucket *pHVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat>_>::Entry>
  *pRVar6;
  ClientHook *pCVar7;
  char *pcVar8;
  int iVar9;
  char (*in_RCX) [117];
  char (*pacVar10) [117];
  Entry *pEVar11;
  String local_1d8;
  Exception local_1c0;
  
  pEVar11 = (this->embargoes).table.rows.builder.ptr;
  pEVar1 = (this->embargoes).table.rows.builder.pos;
  if (pEVar11 != pEVar1) {
    do {
      iVar9 = (*(pEVar11[1].value.disposer)->_vptr_Disposer[1])();
      if ((char)iVar9 != '\0') {
        pDVar2 = pEVar11[1].value.disposer;
        kj::_::Debug::makeDescription<char_const(&)[117]>
                  (&local_1d8,
                   (Debug *)
                   "\"Three-party handoff failed because a connection was lost along the introducing \" \"route before the embargo could clear.\""
                   ,
                   "Three-party handoff failed because a connection was lost along the introducing route before the embargo could clear."
                   ,in_RCX);
        in_RCX = (char (*) [117])0x1106;
        kj::Exception::Exception
                  (&local_1c0,DISCONNECTED,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x1106,&local_1d8);
        (**pDVar2->_vptr_Disposer)(pDVar2,&local_1c0);
        kj::Exception::~Exception(&local_1c0);
        pacVar10 = (char (*) [117])local_1d8.content.size_;
        pcVar8 = local_1d8.content.ptr;
        if (local_1d8.content.ptr != (char *)0x0) {
          local_1d8.content.ptr = (char *)0x0;
          local_1d8.content.size_ = 0;
          (**(local_1d8.content.disposer)->_vptr_ArrayDisposer)
                    (local_1d8.content.disposer,pcVar8,1,pacVar10,pacVar10,0);
          in_RCX = pacVar10;
        }
      }
      pEVar11 = (Entry *)&pEVar11[1].value.ptr;
    } while (pEVar11 != pEVar1);
  }
  pHVar3 = (this->embargoes).table.indexes.buckets.ptr;
  if (pHVar3 != (HashBucket *)0x0) {
    sVar4 = (this->embargoes).table.indexes.buckets.size_;
    (this->embargoes).table.indexes.buckets.ptr = (HashBucket *)0x0;
    (this->embargoes).table.indexes.buckets.size_ = 0;
    pAVar5 = (this->embargoes).table.indexes.buckets.disposer;
    (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pHVar3,8,sVar4,sVar4,0);
  }
  pEVar11 = (this->embargoes).table.rows.builder.ptr;
  if (pEVar11 != (Entry *)0x0) {
    pRVar6 = (this->embargoes).table.rows.builder.pos;
    pEVar1 = (this->embargoes).table.rows.builder.endPtr;
    (this->embargoes).table.rows.builder.ptr = (Entry *)0x0;
    (this->embargoes).table.rows.builder.pos =
         (RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat>_>::Entry>
          *)0x0;
    (this->embargoes).table.rows.builder.endPtr = (Entry *)0x0;
    pAVar5 = (this->embargoes).table.rows.builder.disposer;
    (**pAVar5->_vptr_ArrayDisposer)
              (pAVar5,pEVar11,0x38,((long)pRVar6 - (long)pEVar11 >> 3) * 0x6db6db6db6db6db7,
               ((long)pEVar1 - (long)pEVar11 >> 3) * 0x6db6db6db6db6db7,
               kj::ArrayDisposer::
               Dispose_<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
               ::destruct);
  }
  pCVar7 = (this->client).ptr;
  if (pCVar7 != (ClientHook *)0x0) {
    (this->client).ptr = (ClientHook *)0x0;
    pDVar2 = (this->client).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&pCVar7->_vptr_ClientHook + (long)pCVar7->_vptr_ClientHook[-2]));
  }
  return;
}

Assistant:

~Provide() noexcept(false) {
        for (auto& e: embargoes) {
          if (e.value.fulfiller->isWaiting()) {
            e.value.fulfiller->reject(KJ_EXCEPTION(DISCONNECTED,
                "Three-party handoff failed because a connection was lost along the introducing "
                "route before the embargo could clear."));
          }
        }
      }